

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void tcmalloc::ThreadCache::set_overall_thread_cache_size(size_t new_size)

{
  size_t min_size;
  size_t new_size_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  min_size = new_size;
  if (new_size < min_per_thread_cache_size_) {
    min_size = min_per_thread_cache_size_;
  }
  if (0x40000000 < min_size) {
    min_size = 0x40000000;
  }
  overall_thread_cache_size_ = min_size;
  RecomputePerThreadCacheSize();
  return;
}

Assistant:

void ThreadCache::set_overall_thread_cache_size(size_t new_size) {
  // Clip the value to a reasonable range
  size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
  if (new_size < min_size) {
    new_size = min_size;
  }
  if (new_size > (1<<30)) new_size = (1<<30);     // Limit to 1GB
  overall_thread_cache_size_ = new_size;

  RecomputePerThreadCacheSize();
}